

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serving_request.cpp
# Opt level: O2

void __thiscall
foxxll::serving_request::serving_request
          (serving_request *this,completion_handler *on_cmpl,file *file,void *buffer,
          offset_type offset,size_type bytes,read_or_write op)

{
  *(undefined ***)&(this->super_request_with_state).super_request_with_waiters.super_request =
       &PTR___cxa_pure_virtual_00166fe8;
  request_with_state::request_with_state
            (&this->super_request_with_state,&PTR_PTR_00166d48,on_cmpl,file,buffer,offset,bytes,op);
  *(undefined ***)&(this->super_request_with_state).super_request_with_waiters.super_request =
       &PTR_add_waiter_00166ce0;
  if (file->need_alignment_ == true) {
    request::check_alignment((request *)this);
  }
  return;
}

Assistant:

serving_request::serving_request(
    const completion_handler& on_cmpl,
    file* file, void* buffer, offset_type offset, size_type bytes,
    read_or_write op)
    : request_with_state(on_cmpl, file, buffer, offset, bytes, op)
{
#ifdef FOXXLL_CHECK_BLOCK_ALIGNING
    // Direct I/O requires file system block size alignment for file offsets,
    // memory buffer addresses, and transfer(buffer) size must be multiple
    // of the file system block size
    if (file->need_alignment())
        check_alignment();
#endif
}